

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_threads.c
# Opt level: O2

void ares_queue_notify_empty(ares_channel_t *channel)

{
  size_t sVar1;
  
  if (channel != (ares_channel_t *)0x0) {
    sVar1 = ares_llist_len(channel->all_queries);
    if (sVar1 == 0) {
      ares_thread_cond_broadcast(channel->cond_empty);
      return;
    }
  }
  return;
}

Assistant:

void ares_queue_notify_empty(ares_channel_t *channel)
{
  if (channel == NULL) {
    return;
  }

  /* We are guaranteed to be holding a channel lock already */
  if (ares_llist_len(channel->all_queries)) {
    return;
  }

  /* Notify all waiters of the conditional */
  ares_thread_cond_broadcast(channel->cond_empty);
}